

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ostream * operator<<(ostream *out,ShapeConstraint *shape)

{
  ostream *poVar1;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)&shape->_name);
  poVar1 = std::operator<<(out,local_38);
  std::__cxx11::string::string(local_58,":",&local_59);
  poVar1 = std::operator<<(poVar1,local_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  operator<<(out,&shape->_sequenceRange);
  std::endl<char,std::char_traits<char>>(out);
  operator<<(out,&shape->_batchRange);
  std::endl<char,std::char_traits<char>>(out);
  operator<<(out,&shape->_channelRange);
  std::endl<char,std::char_traits<char>>(out);
  operator<<(out,&shape->_heightRange);
  std::endl<char,std::char_traits<char>>(out);
  operator<<(out,&shape->_widthRange);
  std::endl<char,std::char_traits<char>>(out);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ShapeConstraint& shape) {
    out << shape.name() << std::string(":") << std::endl;
    out << shape.sequenceRange() << std::endl;
    out << shape.batchRange() << std::endl;
    out << shape.channelRange() << std::endl;
    out << shape.heightRange() << std::endl;
    out << shape.widthRange() << std::endl;
    return out;
}